

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O0

LightLiSample * __thiscall
pbrt::GoniometricLight::SampleLi
          (GoniometricLight *this,LightSampleContext ctx,Point2f u,SampledWavelengths lambda,
          LightSamplingMode mode)

{
  SampledSpectrum *this_00;
  float in_EDX;
  long in_RSI;
  LightLiSample *in_RDI;
  undefined1 in_ZMM0 [64];
  undefined1 auVar1 [64];
  undefined1 auVar2 [64];
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 extraout_var [56];
  undefined1 auVar9 [64];
  undefined1 auVar13 [56];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  Point3<float> PVar14;
  Point3f PVar15;
  Vector3<float> VVar16;
  SampledSpectrum SVar17;
  SampledSpectrum L;
  Vector3f wi;
  Point3f p;
  float in_stack_fffffffffffffe28;
  float in_stack_fffffffffffffe2c;
  LightSampleContext *this_01;
  Float time;
  Interaction *this_02;
  Point3<float> *p2;
  LightLiSample *this_03;
  SampledWavelengths *in_stack_fffffffffffffe88;
  GoniometricLight *in_stack_fffffffffffffe90;
  Tuple3<pbrt::Vector3,_float> in_stack_fffffffffffffea8;
  Vector3<float> *in_stack_ffffffffffffff38;
  Transform *in_stack_ffffffffffffff40;
  Point3<float> *in_stack_ffffffffffffffd8;
  float in_stack_ffffffffffffffe0;
  undefined1 auVar10 [56];
  
  this_02 = (Interaction *)&stack0x00000038;
  p2 = (Point3<float> *)&stack0x00000008;
  vmovlpd_avx(in_ZMM0._0_16_);
  this_00 = (SampledSpectrum *)(in_RSI + 0x18);
  this_01 = (LightSampleContext *)&stack0xffffffffffffffcc;
  auVar10 = SUB6456(ZEXT1664((undefined1  [16])0x0),8);
  Point3<float>::Point3
            ((Point3<float> *)this_01,in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28,0.0);
  PVar14 = Transform::operator()
                     ((Transform *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),
                      in_stack_ffffffffffffffd8);
  auVar1._0_8_ = PVar14.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar1._8_56_ = auVar10;
  vmovlpd_avx(auVar1._0_16_);
  PVar15 = LightSampleContext::p(this_01);
  auVar2._0_8_ = PVar15.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar2._8_56_ = auVar10;
  vmovlpd_avx(auVar2._0_16_);
  this_03 = (LightLiSample *)&stack0xffffffffffffffd8;
  VVar16 = Point3<float>::operator-((Point3<float> *)this_02,(Point3<float> *)this_00);
  auVar3._0_8_ = VVar16.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar3._8_56_ = auVar10;
  vmovlpd_avx(auVar3._0_16_);
  VVar16 = Normalize<float>((Vector3<float> *)this_03);
  auVar4._0_8_ = VVar16.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar4._8_56_ = auVar10;
  vmovlpd_avx(auVar4._0_16_);
  VVar16 = Tuple3<pbrt::Vector3,_float>::operator-((Tuple3<pbrt::Vector3,_float> *)this_01);
  auVar5._0_8_ = VVar16.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar5._8_56_ = auVar10;
  vmovlpd_avx(auVar5._0_16_);
  VVar16 = Transform::ApplyInverse<float>(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  auVar6._0_8_ = VVar16.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar6._8_56_ = auVar10;
  vmovlpd_avx(auVar6._0_16_);
  auVar10 = ZEXT856(0);
  auVar13 = (undefined1  [56])0x0;
  SVar17 = Scale(in_stack_fffffffffffffe90,(Vector3f)in_stack_fffffffffffffea8,
                 in_stack_fffffffffffffe88);
  auVar11._0_8_ = SVar17.values.values._8_8_;
  auVar11._8_56_ = auVar13;
  auVar7._0_8_ = SVar17.values.values._0_8_;
  auVar7._8_56_ = auVar10;
  vmovlpd_avx(auVar7._0_16_);
  vmovlpd_avx(auVar11._0_16_);
  PVar15 = LightSampleContext::p(this_01);
  auVar8._0_8_ = PVar15.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar8._8_56_ = auVar10;
  vmovlpd_avx(auVar8._0_16_);
  DistanceSquared<float>((Point3<float> *)this_03,p2);
  auVar10 = extraout_var;
  SVar17 = SampledSpectrum::operator/(this_00,(Float)((ulong)this_01 >> 0x20));
  auVar12._0_8_ = SVar17.values.values._8_8_;
  auVar12._8_56_ = auVar13;
  auVar9._0_8_ = SVar17.values.values._0_8_;
  auVar9._8_56_ = auVar10;
  vmovlpd_avx(auVar9._0_16_);
  vmovlpd_avx(auVar12._0_16_);
  LightHandle::TaggedPointer<pbrt::GoniometricLight_const>
            ((LightHandle *)this_01,
             (GoniometricLight *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
  time = (Float)((ulong)this_01 >> 0x20);
  Interaction::Interaction
            (this_02,(Point3f *)this_00,time,
             (MediumInterface *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
  LightLiSample::LightLiSample
            (this_03,(LightHandle *)p2,(SampledSpectrum *)this_02,(Vector3f *)this_00,time,
             (Interaction *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
  return in_RDI;
}

Assistant:

LightLiSample GoniometricLight::SampleLi(LightSampleContext ctx, Point2f u,
                                         SampledWavelengths lambda,
                                         LightSamplingMode mode) const {
    Point3f p = renderFromLight(Point3f(0, 0, 0));
    Vector3f wi = Normalize(p - ctx.p());
    SampledSpectrum L =
        Scale(renderFromLight.ApplyInverse(-wi), lambda) / DistanceSquared(p, ctx.p());
    return LightLiSample(this, L, wi, 1, Interaction(p, 0 /* time */, &mediumInterface));
}